

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O1

void __thiscall CmdOpts::usage(CmdOpts *this,FILE *out)

{
  ArgHas AVar1;
  Option *pOVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char name [40];
  char local_58 [40];
  
  if (0 < this->_numOpts) {
    lVar3 = 0;
    do {
      pOVar2 = this->_opts;
      AVar1 = pOVar2[lVar3].arg.has;
      if (AVar1 == ArgRequired) {
        pcVar5 = pOVar2[lVar3].arg.name;
        pcVar4 = "  -%c, --%s=%s";
LAB_0010f477:
        snprintf(local_58,0x28,pcVar4,(ulong)(uint)(int)pOVar2[lVar3].letter,pOVar2[lVar3].name,
                 pcVar5);
      }
      else {
        if (AVar1 == ArgOptional) {
          pcVar5 = pOVar2[lVar3].arg.name;
          pcVar4 = "  -%c, --%s[=%s]";
          goto LAB_0010f477;
        }
        snprintf(local_58,0x28,"  -%c, --%s",(ulong)(uint)(int)pOVar2[lVar3].letter,
                 pOVar2[lVar3].name);
      }
      fprintf((FILE *)out,"%-23s ",local_58);
      pcVar5 = this->_opts[lVar3].help;
      pcVar4 = strchr(pcVar5,10);
      while (pcVar4 != (char *)0x0) {
        fwrite(pcVar5,(size_t)(pcVar4 + (1 - (long)pcVar5)),1,(FILE *)out);
        fprintf((FILE *)out,"%24s","");
        pcVar5 = pcVar4 + 1;
        pcVar4 = strchr(pcVar5,10);
      }
      fprintf((FILE *)out,"%s\n",pcVar5);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->_numOpts);
  }
  return;
}

Assistant:

void
CmdOpts::usage(FILE* out)
{
    int optIdx;
    char name[40];
    const char* start;
    const char* end;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
    {
        if (_opts[optIdx].arg.has == ArgOptional)
            snprintf(name, sizeof(name), "  -%c, --%s[=%s]",
                    _opts[optIdx].letter,
                    _opts[optIdx].name,
                    _opts[optIdx].arg.name);
        else if (_opts[optIdx].arg.has == ArgRequired)
            snprintf(name, sizeof(name), "  -%c, --%s=%s",
                     _opts[optIdx].letter,
                     _opts[optIdx].name,
                     _opts[optIdx].arg.name);
        else
            snprintf(name, sizeof(name), "  -%c, --%s",
                     _opts[optIdx].letter,
                     _opts[optIdx].name);

        fprintf(out, "%-23s ", name);

        start = _opts[optIdx].help;
        while ((end = strchr(start, '\n')))
        {
            fwrite(start, end - start + 1, 1, out);
            fprintf(out, "%24s", "");
            start = end + 1;
        }
        fprintf(out, "%s\n", start);
    }
}